

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O3

ssize_t zip_entry_read(zip_t *zip,void **buf,size_t *bufsize)

{
  long lVar1;
  mz_bool mVar2;
  void *pvVar3;
  size_t sVar4;
  mz_uint file_index;
  size_t size;
  size_t local_30;
  
  local_30 = 0;
  if (zip == (zip_t *)0x0) {
    sVar4 = 0xffffffffffffffff;
  }
  else {
    sVar4 = 0xfffffffffffffffd;
    if (((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING) &&
       (lVar1 = (zip->entry).index, -1 < lVar1)) {
      file_index = (mz_uint)lVar1;
      mVar2 = mz_zip_reader_is_file_a_directory(&zip->archive,file_index);
      sVar4 = 0xffffffffffffffef;
      if (mVar2 == 0) {
        pvVar3 = mz_zip_reader_extract_to_heap(&zip->archive,file_index,&local_30,0);
        *buf = pvVar3;
        sVar4 = local_30;
        if (bufsize != (size_t *)0x0 && pvVar3 != (void *)0x0) {
          *bufsize = local_30;
        }
      }
    }
  }
  return sVar4;
}

Assistant:

ssize_t zip_entry_read(struct zip_t *zip, void **buf, size_t *bufsize) {
  mz_zip_archive *pzip = NULL;
  mz_uint idx;
  size_t size = 0;

  if (!zip) {
    // zip_t handler is not initialized
    return (ssize_t)ZIP_ENOINIT;
  }

  pzip = &(zip->archive);
  if (pzip->m_zip_mode != MZ_ZIP_MODE_READING ||
      zip->entry.index < (ssize_t)0) {
    // the entry is not found or we do not have read access
    return (ssize_t)ZIP_ENOENT;
  }

  idx = (mz_uint)zip->entry.index;
  if (mz_zip_reader_is_file_a_directory(pzip, idx)) {
    // the entry is a directory
    return (ssize_t)ZIP_EINVENTTYPE;
  }

  *buf = mz_zip_reader_extract_to_heap(pzip, idx, &size, 0);
  if (*buf && bufsize) {
    *bufsize = size;
  }
  return (ssize_t)size;
}